

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O3

void __thiscall QCommandLinkButton::QCommandLinkButton(QCommandLinkButton *this,QWidget *parent)

{
  QPushButtonPrivate *dd;
  
  dd = (QPushButtonPrivate *)operator_new(0x2f8);
  QAbstractButtonPrivate::QAbstractButtonPrivate((QAbstractButtonPrivate *)dd,PushButton);
  (dd->menu).wp.d = (Data *)0x0;
  (dd->menu).wp.value = (QObject *)0x0;
  dd->field_0x2c8 = dd->field_0x2c8 & 0x80 | 2;
  *(undefined ***)&(dd->super_QAbstractButtonPrivate).super_QWidgetPrivate =
       &PTR__QCommandLinkButtonPrivate_007f0d60;
  *(undefined8 *)&dd[1].super_QAbstractButtonPrivate.super_QWidgetPrivate = 0;
  *(undefined8 *)&dd[1].super_QAbstractButtonPrivate.super_QWidgetPrivate.field_0x8 = 0;
  *(undefined8 *)&dd[1].super_QAbstractButtonPrivate.super_QWidgetPrivate.field_0xc = 0;
  *(undefined8 *)&dd[1].super_QAbstractButtonPrivate.super_QWidgetPrivate.field_0x14 = 0;
  *(undefined2 *)&dd[1].super_QAbstractButtonPrivate.super_QWidgetPrivate.field_0x1c = 0xffff;
  *(undefined8 *)&dd[1].super_QAbstractButtonPrivate.super_QWidgetPrivate.field_0x1e = 0;
  QPushButton::QPushButton((QPushButton *)this,dd,parent);
  *(undefined ***)this = &PTR_metaObject_007f0ad8;
  *(undefined ***)(this + 0x10) = &PTR__QCommandLinkButton_007f0ca8;
  QCommandLinkButtonPrivate::init(*(QCommandLinkButtonPrivate **)(this + 8),(EVP_PKEY_CTX *)dd);
  return;
}

Assistant:

QCommandLinkButton::QCommandLinkButton(QWidget *parent)
: QPushButton(*new QCommandLinkButtonPrivate, parent)
{
    Q_D(QCommandLinkButton);
    d->init();
}